

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O3

int mask_or_r(uint32_t *dmask,uint32_t *smask,int size)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  
  if (0 < size) {
    uVar2 = 0;
    iVar1 = 0;
    do {
      uVar3 = smask[uVar2] | dmask[uVar2];
      if (uVar3 != dmask[uVar2]) {
        iVar1 = 1;
      }
      dmask[uVar2] = uVar3;
      uVar2 = uVar2 + 1;
    } while (size + 0x1fU >> 5 != uVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int mask_or_r(uint32_t *dmask, uint32_t *smask, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	int res = 0;
	for (i = 0; i < rsize; i++) {
		uint32_t n = dmask[i] | smask[i];
		if (n != dmask[i])
			res = 1;
		dmask[i] = n;
	}
	return res;
}